

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O2

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,LocalNameListStatement *l_namelist_stmt,void *data)

{
  SyntaxTree *pSVar1;
  ExpListData exp_list_data;
  NameListData name_list_data;
  size_t local_20;
  
  pSVar1 = (l_namelist_stmt->exp_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (pSVar1 != (SyntaxTree *)0x0) {
    (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  }
  local_20 = 0;
  pSVar1 = (l_namelist_stmt->name_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_20);
  l_namelist_stmt->name_count_ = local_20;
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(LocalNameListStatement *l_namelist_stmt, void *data)
    {
        if (l_namelist_stmt->exp_list_)
        {
            ExpListData exp_list_data;
            l_namelist_stmt->exp_list_->Accept(this, &exp_list_data);
        }

        NameListData name_list_data;
        l_namelist_stmt->name_list_->Accept(this, &name_list_data);
        l_namelist_stmt->name_count_ = name_list_data.name_count_;
    }